

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_init(nn_req *self,nn_sockbase_vfptr *vfptr,void *hint)

{
  nn_timer *self_00;
  nn_fsm_fn in_RDX;
  nn_fsm *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  nn_xreq *in_stack_ffffffffffffffe0;
  
  nn_xreq_init(in_stack_ffffffffffffffe0,
               (nn_sockbase_vfptr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)0x1d8ae7);
  self_00 = (nn_timer *)(in_RDI + 800);
  nn_sockbase_getctx((nn_sockbase *)0x1d8b01);
  nn_fsm_init_root(in_RSI,in_RDX,(nn_fsm_fn)self_00,
                   (nn_ctx *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x378) = 1;
  nn_random_generate(in_RSI,(size_t)in_RDX);
  *(undefined8 *)(in_RDI + 0x538) = 0;
  nn_msg_init((nn_msg *)self_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  nn_msg_init((nn_msg *)self_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  nn_timer_init(self_00,in_stack_ffffffffffffffdc,(nn_fsm *)0x1d8bac);
  *(undefined4 *)(in_RDI + 0x380) = 60000;
  nn_task_init((nn_task *)(in_RDI + 0x388),*(uint32_t *)(in_RDI + 0x37c));
  nn_fsm_start((nn_fsm *)0x1d8be8);
  return;
}

Assistant:

void nn_req_init (struct nn_req *self,
    const struct nn_sockbase_vfptr *vfptr, void *hint)
{
    nn_xreq_init (&self->xreq, vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_req_handler, nn_req_shutdown,
        nn_sockbase_getctx (&self->xreq.sockbase));
    self->state = NN_REQ_STATE_IDLE;

    /*  Start assigning request IDs beginning with a random number. This way
        there should be no key clashes even if the executable is re-started. */
    nn_random_generate (&self->lastid, sizeof (self->lastid));

    self->task.sent_to = NULL;

    nn_msg_init (&self->task.request, 0);
    nn_msg_init (&self->task.reply, 0);
    nn_timer_init (&self->task.timer, NN_REQ_SRC_RESEND_TIMER, &self->fsm);
    self->resend_ivl = NN_REQ_DEFAULT_RESEND_IVL;

    nn_task_init (&self->task, self->lastid);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}